

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.h
# Opt level: O2

type llvm::yaml::yamlize<llvm::yaml::Hex32>(IO *io,Hex32 *Val,bool param_3,EmptyContext *Ctx)

{
  Twine *this;
  StringRef Scalar;
  int iVar1;
  void *pvVar2;
  string *psVar3;
  undefined7 in_register_00000011;
  size_type *psStack_88;
  string Storage;
  raw_string_ostream Buffer;
  StringRef Str;
  
  iVar1 = (*io->_vptr_IO[2])(io,Val,CONCAT71(in_register_00000011,param_3));
  if ((char)iVar1 == '\0') {
    psStack_88 = (size_type *)0x0;
    Storage._M_dataplus._M_p = (pointer)0x0;
    (*io->_vptr_IO[0x1b])(io,&psStack_88,0);
    Scalar.Length = (size_t)Storage._M_dataplus._M_p;
    Scalar.Data = (char *)psStack_88;
    pvVar2 = IO::getContext(io);
    join_0x00000010_0x00000000_ = ScalarTraits<llvm::yaml::Hex32,_void>::input(Scalar,pvVar2,Val);
    if (Buffer._48_8_ != 0) {
      this = (Twine *)((long)&Storage.field_2 + 8);
      Twine::Twine(this,(StringRef *)&Buffer.OS);
      (*io->_vptr_IO[0x1f])(io,this);
    }
  }
  else {
    psStack_88 = &Storage._M_string_length;
    Storage._M_dataplus._M_p = (pointer)0x0;
    Storage._M_string_length._0_1_ = 0;
    Buffer.super_raw_ostream.OutBufCur._0_4_ = 1;
    Buffer.super_raw_ostream._vptr_raw_ostream = (_func_int **)0x0;
    Buffer.super_raw_ostream.OutBufStart = (char *)0x0;
    Buffer.super_raw_ostream.OutBufEnd = (char *)0x0;
    Storage.field_2._8_8_ = &PTR__raw_string_ostream_01129208;
    Buffer.super_raw_ostream._32_8_ = &psStack_88;
    pvVar2 = IO::getContext(io);
    ScalarTraits<llvm::yaml::Hex32,_void>::output
              (Val,pvVar2,(raw_ostream *)((long)&Storage.field_2 + 8));
    psVar3 = raw_string_ostream::str_abi_cxx11_((raw_string_ostream *)((long)&Storage.field_2 + 8));
    Buffer.OS = psVar3->_M_dataplus;
    unique0x100001ad = psVar3->_M_string_length;
    (*io->_vptr_IO[0x1b])(io,&Buffer.OS,0);
    raw_string_ostream::~raw_string_ostream((raw_string_ostream *)((long)&Storage.field_2 + 8));
    std::__cxx11::string::~string((string *)&psStack_88);
  }
  return;
}

Assistant:

typename std::enable_if<has_ScalarTraits<T>::value, void>::type
yamlize(IO &io, T &Val, bool, EmptyContext &Ctx) {
  if ( io.outputting() ) {
    std::string Storage;
    raw_string_ostream Buffer(Storage);
    ScalarTraits<T>::output(Val, io.getContext(), Buffer);
    StringRef Str = Buffer.str();
    io.scalarString(Str, ScalarTraits<T>::mustQuote(Str));
  }
  else {
    StringRef Str;
    io.scalarString(Str, ScalarTraits<T>::mustQuote(Str));
    StringRef Result = ScalarTraits<T>::input(Str, io.getContext(), Val);
    if ( !Result.empty() ) {
      io.setError(Twine(Result));
    }
  }
}